

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AllocatedSizeAtCapacity
          (RepeatedPtrFieldBase *this)

{
  int v2;
  int iVar1;
  string *psVar2;
  Rep *pRVar3;
  size_type sVar4;
  undefined8 uVar5;
  pointer pcVar6;
  bool bVar7;
  LogMessageFatal local_20 [16];
  
  iVar1 = this->current_size_;
  v2 = allocated_size(this);
  psVar2 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                     (iVar1,v2,"size() <= allocated_size()");
  if (psVar2 == (string *)0x0) {
    iVar1 = allocated_size(this);
    psVar2 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,this->capacity_proxy_ + 1,"allocated_size() <= Capacity()");
    if (psVar2 == (string *)0x0) {
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        bVar7 = this->tagged_rep_or_elem_ != (void *)0x0;
      }
      else {
        pRVar3 = rep(this);
        bVar7 = this->capacity_proxy_ < pRVar3->allocated_size;
      }
      return bVar7;
    }
    pcVar6 = (psVar2->_M_dataplus)._M_p;
    sVar4 = psVar2->_M_string_length;
    uVar5 = 0x26a;
  }
  else {
    pcVar6 = (psVar2->_M_dataplus)._M_p;
    sVar4 = psVar2->_M_string_length;
    uVar5 = 0x269;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,uVar5,sVar4,pcVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

inline bool AllocatedSizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This combines optimization mentioned in `SizeAtCapacity()` and simplifies
    // `allocated_size()` in sso case.
    return using_sso() ? (tagged_rep_or_elem_ != nullptr)
                       : rep()->allocated_size >= Capacity();
  }